

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile.c
# Opt level: O3

void ptmr_start(ptmr_t *tm)

{
  timeval e_start;
  rusage start;
  timeval local_b0;
  rusage local_a0;
  
  getrusage(RUSAGE_SELF,&local_a0);
  tm->start_cpu =
       (float64)((double)local_a0.ru_stime.tv_usec * 1e-06 + (double)local_a0.ru_stime.tv_sec +
                (double)local_a0.ru_utime.tv_usec * 1e-06 + (double)local_a0.ru_utime.tv_sec);
  gettimeofday(&local_b0,(__timezone_ptr_t)0x0);
  tm->start_elapsed = (float64)((double)local_b0.tv_usec * 1e-06 + (double)local_b0.tv_sec);
  return;
}

Assistant:

void
ptmr_start(ptmr_t * tm)
{
#if (! defined(_WIN32)) || defined(GNUWINCE) || defined(__SYMBIAN32__)
    struct timeval e_start;     /* Elapsed time */

#if (! defined(_HPUX_SOURCE))  && (! defined(__SYMBIAN32__))
    struct rusage start;        /* CPU time */

    /* Unix but not HPUX */
    getrusage(RUSAGE_SELF, &start);
    tm->start_cpu = make_sec(&start.ru_utime) + make_sec(&start.ru_stime);
#endif
    /* Unix + HP */
    gettimeofday(&e_start, 0);
    tm->start_elapsed = make_sec(&e_start);
#elif defined(_WIN32_WP)
    tm->start_cpu = GetTickCount64() / 1000;
    tm->start_elapsed = GetTickCount64() / 1000;
#elif defined(_WIN32_WCE)
    /* No GetProcessTimes() on WinCE.  (Note CPU time will be bogus) */
    tm->start_cpu = GetTickCount() / 1000;
    tm->start_elapsed = GetTickCount() / 1000;
#else
    HANDLE pid;
    FILETIME t_create, t_exit, kst, ust;

    /* PC */
    pid = GetCurrentProcess();
    GetProcessTimes(pid, &t_create, &t_exit, &kst, &ust);
    tm->start_cpu = make_sec(&ust) + make_sec(&kst);

    tm->start_elapsed = (float64) clock() / CLOCKS_PER_SEC;
#endif
}